

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.hpp
# Opt level: O3

void BCL::barrier(void)

{
  int iVar1;
  debug_error *pdVar2;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = MPI_Win_flush_all(win);
  if (iVar1 != 0) {
    pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&sStack_58,iVar1);
    std::operator+(&local_38,"BCL barrier(): MPI_Win_lock_all returned error code ",&sStack_58);
    debug_error::debug_error(pdVar2,&local_38);
    __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
  }
  iVar1 = MPI_Barrier(comm);
  if (iVar1 == 0) {
    return;
  }
  pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
  std::__cxx11::to_string(&sStack_58,iVar1);
  std::operator+(&local_38,"BCL barrier(): MPI_Barrier returned error code ",&sStack_58);
  debug_error::debug_error(pdVar2,&local_38);
  __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
}

Assistant:

void barrier() {
  int error_code = MPI_Win_flush_all(win);
  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL barrier(): MPI_Win_lock_all returned error code " + std::to_string(error_code));
          }
  )
  error_code = MPI_Barrier(BCL::comm);
  BCL_DEBUG(
          if (error_code != MPI_SUCCESS) {
            throw debug_error("BCL barrier(): MPI_Barrier returned error code " + std::to_string(error_code));
          }
  )
}